

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

Node * __thiscall Node::OutputPassmech_abi_cxx11_(Node *this,int FunctionFlag)

{
  undefined4 in_register_00000034;
  int FunctionFlag_local;
  Node *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)this);
  if (*(int *)CONCAT44(in_register_00000034,FunctionFlag) == 0x129) {
    std::__cxx11::string::operator=((string *)this,"& /* Descriptor */ ");
  }
  else if (*(int *)CONCAT44(in_register_00000034,FunctionFlag) == 0x186) {
    std::__cxx11::string::operator=((string *)this,"&");
  }
  return this;
}

Assistant:

std::string Node::OutputPassmech(
	int FunctionFlag	/**> Function flag */
)
{
	std::string result;

	switch(Type)
	{
	case BAS_S_VALUE:
		break;

	case BAS_S_REF:
		result = "&";
		break;

	case BAS_S_DESC:
		result = "& /* Descriptor */ ";
		break;
	}

	return result;
}